

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::interface_to_endpoints
          (aux *this,listen_interface_t *iface,listen_socket_flags_t flags,
          span<const_libtorrent::aux::ip_interface> ifs,
          vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          *eps)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  int iVar1;
  uint uVar2;
  int *piVar3;
  undefined7 in_register_00000011;
  address *a;
  byte bVar4;
  long lVar5;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__cp;
  ip_interface *__begin3;
  bool bVar6;
  transport ssl;
  address adr;
  bytes_type bytes;
  bytes_type bytes_1;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_e2;
  aux local_e1;
  char *local_e0;
  int *local_d8;
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
  *local_d0;
  address local_c8;
  char local_a0;
  byte bStack_9f;
  undefined6 uStack_9e;
  undefined8 uStack_98;
  ip_interface *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  a = (address *)CONCAT71(in_register_00000011,flags.m_val);
  local_d0 = (vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)ifs.m_len;
  local_90 = ifs.m_ptr;
  bVar4 = (char)this[0x25] * '\x02' | (byte)iface;
  local_e1 = this[0x24];
  __s = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  local_e2.m_val = bVar4;
  piVar3 = __errno_location();
  *piVar3 = 0;
  local_e0 = strchr((char *)__s,0x25);
  __cp = __s;
  local_d8 = piVar3;
  if (local_e0 == (char *)0x0) {
LAB_002bf968:
    piVar3 = local_d8;
    iVar1 = inet_pton(10,(char *)__cp,&local_a0);
    bVar6 = *piVar3 == 0;
    if (0 < iVar1) {
      if (local_e0 == (char *)0x0) {
        local_c8.ipv6_address_.scope_id_ = 0;
      }
      else if ((((local_a0 == -2) || (local_a0 != -1)) || ((bStack_9f & 0xf) != 2)) ||
              (uVar2 = if_nametoindex(local_e0 + 1), uVar2 == 0)) {
        iVar1 = atoi(local_e0 + 1);
        local_c8.ipv6_address_.scope_id_ = (unsigned_long)iVar1;
      }
      else {
        local_c8.ipv6_address_.scope_id_ = (unsigned_long)uVar2;
      }
      local_88 = CONCAT62(uStack_9e,CONCAT11(bStack_9f,local_a0));
      uStack_80 = uStack_98;
      goto LAB_002bf9fc;
    }
  }
  else {
    __n = (long)local_e0 - (long)__s;
    if ((long)__n < 0x40) {
      __cp = local_78;
      memcpy(__cp,__s,__n);
      *(undefined1 *)((long)local_78 + __n) = 0;
      goto LAB_002bf968;
    }
  }
  local_88 = 0;
  uStack_80 = 0;
  bVar6 = false;
  local_c8.ipv6_address_.scope_id_ = 0;
LAB_002bf9fc:
  piVar3 = local_d8;
  if (bVar6) {
    local_c8.type_ = ipv6;
    local_c8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_c8.ipv6_address_.addr_.__in6_u._0_8_ = local_88;
    local_c8.ipv6_address_.addr_.__in6_u._8_8_ = uStack_80;
  }
  else {
    *local_d8 = 0;
    iVar1 = inet_pton(2,(char *)__s,local_78);
    if ((iVar1 < 1) || (*piVar3 != 0)) {
      local_c8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_c8.ipv6_address_.scope_id_ = 0;
      local_c8.type_ = ipv4;
      local_c8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_c8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_e2.m_val = bVar4 | 4;
      if (local_90 == (ip_interface *)0x0) {
        return;
      }
      lVar5 = (long)local_90 * 400;
      do {
        iVar1 = ::std::__cxx11::string::compare((char *)this);
        if (iVar1 == 0) {
          if (this[0x25] == (aux)0x0) {
            if (a->type_ == ipv4) {
              if ((char)(a->ipv4_address_).addr_.s_addr != '\x7f') goto LAB_002bfb2f;
              goto LAB_002bfaf5;
            }
            if (((*(long *)&(a->ipv6_address_).addr_.__in6_u == 0) &&
                ((int)*(undefined8 *)((long)&(a->ipv6_address_).addr_.__in6_u + 8) == 0)) &&
               (((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] == '\0' &&
                 (a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
                (((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] == '\0' &&
                 ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] == '\x01'))))))
            goto LAB_002bfaf5;
LAB_002bfb2f:
            bVar6 = is_link_local(a);
            bVar4 = bVar6 * '\x02';
          }
          else {
LAB_002bfaf5:
            bVar4 = 2;
          }
          local_78[0]._M_dataplus._M_p._0_1_ = bVar4 | local_e2.m_val;
          ::std::
          vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
          ::
          emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                    (local_d0,a,(int *)(this + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (transport *)&local_e1,
                     (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *
                     )local_78);
        }
        a = (address *)(a[0xc].ipv6_address_.addr_.__in6_u.__u6_addr8 + 8);
        lVar5 = lVar5 + -400;
        if (lVar5 == 0) {
          return;
        }
      } while( true );
    }
    local_c8._0_8_ = (long)local_78[0]._M_dataplus._M_p << 0x20;
    local_c8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_c8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_c8.ipv6_address_.scope_id_ = 0;
  }
  local_78[0]._M_string_length = 0;
  local_78[0].field_2._M_local_buf[0] = '\0';
  local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
  emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>&>
            (local_d0,&local_c8,(int *)(this + 0x20),local_78,(transport *)&local_e1,&local_e2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
    operator_delete(local_78[0]._M_dataplus._M_p,
                    CONCAT71(local_78[0].field_2._M_allocated_capacity._1_7_,
                             local_78[0].field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void interface_to_endpoints(listen_interface_t const& iface
		, listen_socket_flags_t flags
		, span<ip_interface const> const ifs
		, std::vector<listen_endpoint_t>& eps)
	{
		flags |= iface.local ? listen_socket_t::local_network : listen_socket_flags_t{};
		transport const ssl = iface.ssl ? transport::ssl : transport::plaintext;

		// First, check to see if it's an IP address
		error_code err;
		address const adr = make_address(iface.device.c_str(), err);
		if (!err)
		{
			eps.emplace_back(adr, iface.port, std::string{}, ssl, flags);
		}
		else
		{
			flags |= listen_socket_t::was_expanded;

			// this is the case where device names a network device. We need to
			// enumerate all IPs associated with this device
			for (auto const& ipface : ifs)
			{
				// we're looking for a specific interface, and its address
				// (which must be of the same family as the address we're
				// connecting to)
				if (iface.device != ipface.name) continue;

				bool const local = iface.local
					|| ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address);

				eps.emplace_back(ipface.interface_address, iface.port, iface.device
					, ssl, flags | (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}